

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O2

void verifyOrthonormal<float>(Matrix44<float> *A)

{
  uint __line;
  long lVar1;
  long lVar2;
  Matrix44<float> *pMVar3;
  char *__assertion;
  Matrix44<float> prod;
  Matrix44<float> local_58;
  
  pMVar3 = &prod;
  Imath_2_5::Matrix44<float>::transposed(A);
  Imath_2_5::Matrix44<float>::operator*(&prod,A,&local_58);
  lVar1 = 0;
  do {
    if (lVar1 == 4) {
      return;
    }
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      if (lVar1 == lVar2) {
        if (1.1920929e-05 < ABS(*(float *)((long)prod.x + lVar1 * 0x14) + -1.0)) {
          __assertion = "std::abs (prod[i][j] - 1) <= valueEps";
          __line = 0x4d;
LAB_0013d29c:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testTinySVD.cpp"
                        ,__line,"void verifyOrthonormal(const Imath_2_5::Matrix44<T> &) [T = float]"
                       );
        }
      }
      else if (1.1920929e-05 < ABS(*(float *)((long)pMVar3 + lVar2 * 4))) {
        __assertion = "std::abs (prod[i][j]) <= valueEps";
        __line = 0x4f;
        goto LAB_0013d29c;
      }
    }
    lVar1 = lVar1 + 1;
    pMVar3 = (Matrix44<float> *)((long)pMVar3 + 0x10);
  } while( true );
}

Assistant:

void
verifyOrthonormal (const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A)
{
    const T valueEps = T(100) * std::numeric_limits<T>::epsilon();

    const IMATH_INTERNAL_NAMESPACE::Matrix44<T> prod = A * A.transposed();
    for (int i = 0; i < 4; ++i)
    {
        for (int j = 0; j < 4; ++j)
        {
            if (i == j)
                assert (std::abs (prod[i][j] - 1) <= valueEps);
            else
                assert (std::abs (prod[i][j]) <= valueEps);
        }
    }
}